

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O2

void __thiscall
TypeTest_HeapTypeConstructors_Test::TestBody(TypeTest_HeapTypeConstructors_Test *this)

{
  HeapType HVar1;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  char *pcVar2;
  char *in_R9;
  Signature SVar3;
  initializer_list<wasm::Field> __l;
  Array AVar4;
  Signature signature;
  initializer_list<wasm::Field> __l_00;
  Signature SVar5;
  initializer_list<wasm::Field> __l_01;
  Array AVar6;
  uintptr_t local_140 [2];
  Array local_130;
  uintptr_t local_120 [2];
  Type local_110;
  Type local_108;
  HeapType local_100;
  HeapType sig2;
  HeapType struct2;
  Type local_e8;
  HeapType local_e0;
  HeapType array;
  BuildResult result;
  HeapType local_b0;
  HeapType sig;
  HeapType struct_;
  TypeBuilder builder;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_78;
  HeapType array2;
  undefined1 auStack_58 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_38;
  Field local_30;
  
  SVar3.results.id = 2;
  SVar3.params.id = 2;
  ::wasm::HeapType::HeapType(&local_b0,SVar3);
  ::wasm::Type::Type(&local_110,local_b0,Nullable,Inexact);
  auStack_58 = (undefined1  [8])local_110.id;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0x1000000;
  __l._M_len = 1;
  __l._M_array = (iterator)auStack_58;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&builder,__l,
             (allocator_type *)&stack0xffffffffffffff88);
  array.id = (uintptr_t)
             builder.impl._M_t.
             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  ::wasm::HeapType::HeapType(&sig,(Struct *)&array);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&array);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&builder);
  ::wasm::Type::Type(&local_108,sig,Nullable,Inexact);
  local_140[0] = local_108.id;
  local_140[1] = 0x100000000;
  AVar4.element.packedType = (int)extraout_RDX;
  AVar4.element.mutable_ = (int)((ulong)extraout_RDX >> 0x20);
  AVar4.element.type.id = (uintptr_t)local_140;
  ::wasm::HeapType::HeapType(&local_e0,AVar4);
  ::wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&struct_,3);
  signature.results.id = 2;
  signature.params.id = 2;
  array.id = (uintptr_t)&struct_;
  ::wasm::TypeBuilder::Entry::operator=((Entry *)&array,signature);
  array.id = (uintptr_t)&struct_;
  HVar1 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&array);
  auStack_58 = (undefined1  [8])
               ::wasm::TypeBuilder::getTempRefType((HeapType)&struct_,(Nullability)HVar1.id,Exact);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0x1000000;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)auStack_58;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&builder,__l_00,
             (allocator_type *)&local_30);
  array.id = (uintptr_t)
             builder.impl._M_t.
             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  array2.id = 1;
  _Stack_78._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&struct_;
  ::wasm::TypeBuilder::Entry::operator=((Entry *)&stack0xffffffffffffff88,(Struct *)&array);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&array);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&builder);
  array.id = (uintptr_t)&struct_;
  HVar1 = ::wasm::TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)&array);
  local_130.element.type.id =
       ::wasm::TypeBuilder::getTempRefType((HeapType)&struct_,(Nullability)HVar1.id,Exact);
  local_130.element.packedType = not_packed;
  local_130.element.mutable_ = Mutable;
  array.id = (uintptr_t)&struct_;
  ::wasm::TypeBuilder::Entry::operator=((Entry *)&array,&local_130);
  ::wasm::TypeBuilder::build();
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  auStack_58[0] =
       (internal)
       (result.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _M_first._M_storage._M_storage[0x10] == '\0');
  if (result.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _M_first._M_storage._M_storage[0x10] == '\0') {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)&array);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&builder,__x);
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              ((internal *)auStack_58,"built[0]","sig",
               (HeapType *)
               builder.impl._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,&local_b0);
    if (auStack_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffff88);
      if (gtest_ar_._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x269,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_30,(Message *)&stack0xffffffffffffff88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
      if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )_Stack_78._M_head_impl !=
          (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)((long)*(__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
                             *)_Stack_78._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              ((internal *)auStack_58,"built[1]","struct_",
               (HeapType *)
               ((long)builder.impl._M_t.
                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl + 8),
               &sig);
    if (auStack_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffff88);
      if (gtest_ar_._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x26a,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_30,(Message *)&stack0xffffffffffffff88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )_Stack_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)((long)*(__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
                             *)_Stack_78._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              ((internal *)auStack_58,"built[2]","array",
               (HeapType *)
               ((long)builder.impl._M_t.
                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl + 0x10),
               &local_e0);
    if (auStack_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffff88);
      if (gtest_ar_._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x26b,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_30,(Message *)&stack0xffffffffffffff88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )_Stack_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)((long)*(unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                             *)_Stack_78._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    SVar5.results.id = 2;
    SVar5.params.id = 2;
    ::wasm::HeapType::HeapType(&local_100,SVar5);
    ::wasm::Type::Type((Type *)&struct2,local_b0,Nullable,Inexact);
    local_30.type.id = struct2.id;
    local_30.packedType = not_packed;
    local_30.mutable_ = Mutable;
    __l_01._M_len = 1;
    __l_01._M_array = &local_30;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffff88,__l_01,
               (allocator_type *)&local_38);
    auStack_58 = (undefined1  [8])_Stack_78._M_head_impl;
    gtest_ar_._0_8_ = array2.id;
    _Stack_78._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    array2.id = 0;
    ::wasm::HeapType::HeapType(&sig2,(Struct *)auStack_58);
    std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
              ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_58);
    std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
              ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffff88);
    ::wasm::Type::Type(&local_e8,sig,Nullable,Inexact);
    local_120[0] = local_e8.id;
    local_120[1] = 0x100000000;
    AVar6.element.packedType = (int)extraout_RDX_00;
    AVar6.element.mutable_ = (int)((ulong)extraout_RDX_00 >> 0x20);
    AVar6.element.type.id = (uintptr_t)local_120;
    ::wasm::HeapType::HeapType((HeapType *)&stack0xffffffffffffff88,AVar6);
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              ((internal *)auStack_58,"sig","sig2",&local_b0,&local_100);
    if (auStack_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_30);
      if (gtest_ar_._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x271,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((long *)local_30.type.id != (long *)0x0) {
        (**(code **)(*(long *)local_30.type.id + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              ((internal *)auStack_58,"struct_","struct2",&sig,&sig2);
    if (auStack_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_30);
      if (gtest_ar_._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x272,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((long *)local_30.type.id != (long *)0x0) {
        (**(code **)(*(long *)local_30.type.id + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
              ((internal *)auStack_58,"array","array2",&local_e0,
               (HeapType *)&stack0xffffffffffffff88);
    if (auStack_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_30);
      if (gtest_ar_._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x273,pcVar2);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if ((long *)local_30.type.id != (long *)0x0) {
        (**(code **)(*(long *)local_30.type.id + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
              ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&builder);
  }
  else {
    testing::Message::Message((Message *)&stack0xffffffffffffff88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&builder,(internal *)auStack_58,(AssertionResult *)0x24efbd,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x266,(char *)builder.impl._M_t.
                              super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                              .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl)
    ;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_30,(Message *)&stack0xffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    std::__cxx11::string::~string((string *)&builder);
    if (_Stack_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)((long)*(__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
                           *)_Stack_78._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)&array);
  ::wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&struct_);
  return;
}

Assistant:

TEST_F(TypeTest, HeapTypeConstructors) {
  HeapType sig(Signature(Type::i32, Type::i32));
  HeapType struct_(Struct({Field(Type(sig, Nullable), Mutable)}));
  HeapType array(Field(Type(struct_, Nullable), Mutable));

  TypeBuilder builder(3);
  builder[0] = Signature(Type::i32, Type::i32);
  Type sigRef = builder.getTempRefType(builder[0], Nullable);
  builder[1] = Struct({Field(sigRef, Mutable)});
  Type structRef = builder.getTempRefType(builder[1], Nullable);
  builder[2] = Array(Field(structRef, Mutable));

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[0], sig);
  EXPECT_EQ(built[1], struct_);
  EXPECT_EQ(built[2], array);

  HeapType sig2(Signature(Type::i32, Type::i32));
  HeapType struct2(Struct({Field(Type(sig, Nullable), Mutable)}));
  HeapType array2(Field(Type(struct_, Nullable), Mutable));

  EXPECT_EQ(sig, sig2);
  EXPECT_EQ(struct_, struct2);
  EXPECT_EQ(array, array2);
}